

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LR1.cpp
# Opt level: O3

Node * __thiscall LR::parser(LR *this,string *str)

{
  pointer *ppiVar1;
  pointer pcVar2;
  pointer pPVar3;
  pointer pbVar4;
  iterator iVar5;
  actionStat aVar6;
  ostream *poVar7;
  long *plVar8;
  iterator iVar9;
  mapped_type *pmVar10;
  Node *pNVar11;
  long lVar12;
  pointer pbVar13;
  mapped_type *__args;
  pointer piVar14;
  pointer pbVar15;
  Node **__args_00;
  ulong uVar16;
  long lVar17;
  _Alloc_hider _Var18;
  long lVar19;
  ulong uVar20;
  int i;
  vector<Node_*,_std::allocator<Node_*>_> node_vec;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  goto_pair;
  vector<Node_*,_std::allocator<Node_*>_> childs;
  Node *father;
  pair<LR::actionStat,_int> act;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> p;
  Prod p_1;
  string string1;
  int local_1fc;
  undefined8 *local_1f8;
  iterator iStack_1f0;
  Node **local_1e8;
  ulong local_1d8;
  undefined1 local_1d0 [8];
  _Alloc_hider local_1c8;
  undefined1 local_1c0 [8];
  char local_1b8 [16];
  vector<Node_*,_std::allocator<Node_*>_> local_1a8;
  vector<int,std::allocator<int>> *local_188;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_180;
  map<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<LR::actionStat,_int>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<LR::actionStat,_int>_>_>_>
  *local_178;
  _Base_ptr local_170;
  Node *local_168;
  mapped_type local_160;
  map<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int>_>_>
  *local_158;
  undefined1 local_150 [8];
  _Alloc_hider local_148;
  char local_138 [16];
  Prod local_128;
  string local_90;
  string local_70;
  string local_50;
  
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
  std::ostream::put('`');
  poVar7 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"************parse...",0x14);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,(str->_M_dataplus)._M_p,str->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"*************",0xd);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  local_1f8 = (undefined8 *)0x0;
  iStack_1f0._M_current = (Node **)0x0;
  local_1e8 = (Node **)0x0;
  local_188 = (vector<int,std::allocator<int>> *)&this->status;
  local_178 = &this->ACTION;
  local_170 = &(this->ACTION)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_180 = &this->parse;
  local_158 = &this->GOTO;
  local_1d8 = 0;
  local_1fc = 0;
  do {
    if ((local_1d8 & 1) != 0) break;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"step:",5);
    plVar8 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_1fc);
    std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
    std::ostream::put((char)plVar8);
    std::ostream::flush();
    piVar14 = (this->status).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    pbVar13 = (this->inStr).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    lVar19 = ((long)(this->inStr).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar13) * 0x8000000 +
             -0x100000000;
    lVar17 = lVar19 >> 0x1b;
    local_150._0_4_ =
         *(int *)((long)piVar14 +
                 (((long)(this->status).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)piVar14) * 0x40000000 +
                  -0x100000000 >> 0x1e));
    lVar12 = *(long *)((long)&(pbVar13->_M_dataplus)._M_p + lVar17);
    local_148._M_p = local_138;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_148,lVar12,
               *(long *)((long)&pbVar13->_M_string_length + lVar17) + lVar12);
    iVar9 = std::
            _Rb_tree<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<const_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<LR::actionStat,_int>_>,_std::_Select1st<std::pair<const_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<LR::actionStat,_int>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<LR::actionStat,_int>_>_>_>
            ::find(&local_178->_M_t,(key_type *)local_150);
    if (iVar9._M_node != local_170) {
      pmVar10 = std::
                map<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<LR::actionStat,_int>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<LR::actionStat,_int>_>_>_>
                ::operator[](local_178,(key_type *)local_150);
      local_160 = *pmVar10;
      aVar6 = local_160.first;
      if (aVar6 == ACCEPT) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Success!",8);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
        std::ostream::put('`');
        local_1d8 = CONCAT71((int7)((ulong)piVar14 >> 8),1);
        std::ostream::flush();
      }
      else {
        if (aVar6 == REDUCE) {
          lVar12 = (long)local_160 >> 0x20;
          pPVar3 = (this->G).prods.super__Vector_base<Prod,_std::allocator<Prod>_>._M_impl.
                   super__Vector_impl_data._M_start;
          local_128.noTerminal._M_dataplus._M_p = (pointer)&local_128.noTerminal.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_128,*(long *)&pPVar3[lVar12].noTerminal,
                     *(size_type *)((long)(pPVar3 + lVar12) + 8) +
                     *(long *)&pPVar3[lVar12].noTerminal);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_128.right,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)(pPVar3 + lVar12) + 0x20));
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_Rb_tree(&local_128.additionalVt._M_t,
                     (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)(pPVar3 + lVar12) + 0x38));
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::_Rb_tree(&local_128.attrs._M_t,
                     (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)((long)(pPVar3 + lVar12) + 0x68));
          Prod::all_str_abi_cxx11_(&local_50,&local_128);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1d0,"REDUCE: ",&local_50);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,
                              (char *)CONCAT44(local_1d0._4_4_,local_1d0._0_4_),(long)local_1c8._M_p
                             );
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          if ((undefined1 *)CONCAT44(local_1d0._4_4_,local_1d0._0_4_) != local_1c0) {
            operator_delete((undefined1 *)CONCAT44(local_1d0._4_4_,local_1d0._0_4_));
          }
          local_1a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_1a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (Node **)0x0;
          local_1a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (Node **)0x0;
          if ((long)local_128.right.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_128.right.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start != 0) {
            uVar16 = (long)local_128.right.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_128.right.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5;
            lVar12 = 0;
            uVar20 = 0;
            do {
              __args_00 = iStack_1f0._M_current + lVar12 + uVar16 * -8;
              if (local_1a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_1a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
                          ((vector<Node*,std::allocator<Node*>> *)&local_1a8,
                           (iterator)
                           local_1a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                           super__Vector_impl_data._M_finish,__args_00);
              }
              else {
                *local_1a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                 super__Vector_impl_data._M_finish = *__args_00;
                local_1a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_1a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              uVar20 = uVar20 + 1;
              uVar16 = (long)local_128.right.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_128.right.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5;
              lVar12 = lVar12 + 8;
            } while (uVar20 < uVar16);
            if (local_128.right.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                local_128.right.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              uVar16 = 0;
              pbVar13 = local_128.right.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pbVar15 = local_128.right.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              do {
                ppiVar1 = &(this->status).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish;
                *ppiVar1 = *ppiVar1 + -1;
                pbVar4 = (this->parse).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                (this->parse).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = pbVar4 + -1;
                pcVar2 = pbVar4[-1]._M_dataplus._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)pcVar2 != &pbVar4[-1].field_2) {
                  operator_delete(pcVar2);
                  pbVar13 = local_128.right.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  pbVar15 = local_128.right.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                }
                iStack_1f0._M_current = iStack_1f0._M_current + -1;
                uVar16 = uVar16 + 1;
              } while (uVar16 < (ulong)((long)pbVar15 - (long)pbVar13 >> 5));
            }
          }
          pNVar11 = (Node *)operator_new(0x100);
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_90,local_128.noTerminal._M_dataplus._M_p,
                     local_128.noTerminal._M_dataplus._M_p + local_128.noTerminal._M_string_length);
          Node::Node(pNVar11,&local_90);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p);
          }
          local_168 = pNVar11;
          std::__cxx11::string::_M_assign((string *)&pNVar11->prod);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=(&(pNVar11->prod).right,&local_128.right);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=(&(pNVar11->prod).additionalVt._M_t,&local_128.additionalVt._M_t);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator=(&(pNVar11->prod).attrs._M_t,&local_128.attrs._M_t);
          if (iStack_1f0._M_current == local_1e8) {
            std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
                      ((vector<Node*,std::allocator<Node*>> *)&local_1f8,iStack_1f0,&local_168);
          }
          else {
            *iStack_1f0._M_current = local_168;
            iStack_1f0._M_current = iStack_1f0._M_current + 1;
          }
          std::vector<Node_*,_std::allocator<Node_*>_>::operator=
                    (&iStack_1f0._M_current[-1]->childs,&local_1a8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(local_180,&local_128.noTerminal);
          local_1d0._0_4_ =
               (this->status).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish[-1];
          local_1c8._M_p = local_1b8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1c8,local_128.noTerminal._M_dataplus._M_p,
                     local_128.noTerminal._M_dataplus._M_p + local_128.noTerminal._M_string_length);
          __args = std::
                   map<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int>_>_>
                   ::operator[](local_158,(key_type *)local_1d0);
          iVar5._M_current =
               (this->status).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              (this->status).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      (local_188,iVar5,__args);
          }
          else {
            *iVar5._M_current = *__args;
            (this->status).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar5._M_current + 1;
          }
          if (local_1c8._M_p != local_1b8) {
            operator_delete(local_1c8._M_p);
          }
          if (local_1a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_1a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree(&local_128.attrs._M_t);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree(&local_128.additionalVt._M_t);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_128.right);
          pbVar13 = &local_128.noTerminal;
          _Var18._M_p = local_128.noTerminal._M_dataplus._M_p;
        }
        else {
          if (aVar6 != SHIFT) goto LAB_0010533d;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"SHIFT",5);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
          std::ostream::put('`');
          std::ostream::flush();
          pNVar11 = (Node *)operator_new(0x100);
          lVar19 = lVar19 >> 0x20;
          pbVar13 = (this->inStr).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          pcVar2 = pbVar13[lVar19]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_70,pcVar2,pcVar2 + pbVar13[lVar19]._M_string_length);
          Node::Node(pNVar11,&local_70);
          local_128.noTerminal._M_dataplus._M_p = (pointer)pNVar11;
          if (iStack_1f0._M_current == local_1e8) {
            std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*>
                      ((vector<Node*,std::allocator<Node*>> *)&local_1f8,iStack_1f0,
                       (Node **)&local_128);
          }
          else {
            *iStack_1f0._M_current = pNVar11;
            iStack_1f0._M_current = iStack_1f0._M_current + 1;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p);
          }
          iVar5._M_current =
               (this->status).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              (this->status).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      (local_188,iVar5,&local_160.second);
          }
          else {
            *iVar5._M_current = local_160.second;
            (this->status).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar5._M_current + 1;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(local_180,
                      (this->inStr).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar19);
          pbVar15 = (this->inStr).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          (this->inStr).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = pbVar15 + -1;
          pbVar13 = pbVar15 + -1;
          _Var18._M_p = (pointer)pbVar15[-1]._M_dataplus._M_p;
        }
        if ((Node *)_Var18._M_p != (Node *)&pbVar13->field_2) {
          operator_delete(_Var18._M_p);
        }
      }
LAB_0010533d:
      local_1fc = local_1fc + 1;
    }
    if (local_148._M_p != local_138) {
      operator_delete(local_148._M_p);
    }
  } while (iVar9._M_node != local_170);
  if ((local_1d8 & 1) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"parse error!",0xc);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
    std::ostream::put('`');
    std::ostream::flush();
  }
  pNVar11 = (Node *)*local_1f8;
  operator_delete(local_1f8);
  return pNVar11;
}

Assistant:

Node *LR::parser(string &str) {
    cout << endl << "************parse..." << str << "*************" << endl;

    bool success = false;
    vector<Node *> node_vec;
    int step = 0;
    while (!success) {
        cout << "step:" << step << endl;
        int sTop = status.size() - 1; // 栈顶
        int iTop = inStr.size() - 1;
        pair<int, string> p = make_pair(status[sTop], inStr[iTop]);
        if (ACTION.find(p) == ACTION.end())  // 出错！
            break;
        pair<actionStat, int> act = ACTION[p];
        if (act.first == SHIFT) { // 移进
            cout << "SHIFT" << endl;
            node_vec.push_back(new Node(inStr[iTop]));

            status.push_back(act.second);
            parse.push_back(inStr[iTop]);
            inStr.pop_back();
        } else if (act.first == REDUCE) {
            Prod p = G.prods[act.second];//要规约的表达式
            string string1 = p.all_str();
            cout << "REDUCE: " + string1 << endl;
            vector<Node *> childs;
            for (int i = 0; i < p.right.size(); i++) {
                childs.push_back(node_vec[i + node_vec.size() - p.right.size()]);
            }


            if (p.right.size() != 0) { // 空串，无需出栈，直接规约
                for (int i = 0; i < p.right.size(); i++) {
                    status.pop_back();
                    parse.pop_back();
                    node_vec.pop_back();
                }
            }
            Node *father = new Node(p.noTerminal);
            father->prod = p;
            node_vec.push_back(father);
            node_vec[node_vec.size() - 1]->childs = childs;


            parse.push_back(p.noTerminal);
            sTop = status.size() - 1; // 栈顶
            iTop = inStr.size() - 1;
            pair<int, string> goto_pair =
                    make_pair(status[status.size() - 1], p.noTerminal);
            status.push_back(GOTO[goto_pair]);
        } else if (act.first == ACCEPT) {
            success = true;
            cout << "Success!" << endl;
        }
        step++;
    }
    if (!success) {
        cout << "parse error!" << endl;
    }
    return node_vec[0];
}